

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_callscrn.c
# Opt level: O3

int main(int argc,char **argv)

{
  void *__ptr;
  FILE *pFVar1;
  size_t sVar2;
  size_t sVar3;
  char **ppcVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  byte *pbVar9;
  void *__ptr_00;
  long local_68;
  size_t local_60;
  char phone_number_str [20];
  
  phone_number_str[0] = '\0';
  phone_number_str[1] = '\0';
  phone_number_str[2] = '\0';
  phone_number_str[3] = '\0';
  phone_number_str[4] = '\0';
  phone_number_str[5] = '\0';
  phone_number_str[6] = '\0';
  phone_number_str[7] = '\0';
  phone_number_str[8] = '\0';
  phone_number_str[9] = '\0';
  phone_number_str[10] = '\0';
  phone_number_str[0xb] = '\0';
  phone_number_str[0xc] = '\0';
  phone_number_str[0xd] = '\0';
  phone_number_str[0xe] = '\0';
  phone_number_str[0xf] = '\0';
  phone_number_str[0x10] = '\0';
  phone_number_str[0x11] = '\0';
  phone_number_str[0x12] = '\0';
  phone_number_str[0x13] = '\0';
  if (argc < 2) {
    puts(
        "Usage:\n\tmm_callscrn mm_table_18.bin [outputfile.bin]\n\tmm_callscrn mm_table_3b.bin [outputfile.bin]\n\tmm_callscrn mm_table_5c.bin [outputfile.bin]"
        );
    return -1;
  }
  puts("Nortel Millennium Call Screening List Table 24, 59, 92 (0x18, 0x3b, 0x5c) Dump\n");
  __ptr = calloc(1,0xd49);
  if (__ptr == (void *)0x0) {
    printf("Failed to allocate %zu bytes.\n",0xbf5);
    return -0xc;
  }
  pFVar1 = fopen(argv[1],"rb");
  if (pFVar1 == (FILE *)0x0) {
    printf("Error opening %s\n",argv[1]);
    free(__ptr);
LAB_00104364:
    iVar6 = -2;
  }
  else {
    fseek(pFVar1,0,2);
    sVar2 = ftell(pFVar1);
    fseek(pFVar1,0,0);
    if ((long)sVar2 < 0xbf4) {
      local_60 = 8;
      if (sVar2 == 0x2d0) {
        local_68 = 0x3c;
        pcVar8 = "Call Screen Universal (60-entry) table.";
        goto LAB_001043ed;
      }
      if (sVar2 == 0x3fc) {
        local_68 = 0x55;
        pcVar8 = "Call Screen Enhanced (85-entry) table.";
        goto LAB_001043ed;
      }
LAB_001043a1:
      printf("Invalid Call Screening table, len=%zu.\n",sVar2);
    }
    else {
      if (sVar2 == 0xbf4) {
        local_60 = 9;
        local_68 = 0xb4;
        pcVar8 = "Call Screening List (180-entry) table.";
      }
      else {
        if (sVar2 != 0xd48) goto LAB_001043a1;
        local_60 = 9;
        local_68 = 200;
        pcVar8 = "Call Screening List (200-entry) table.";
      }
LAB_001043ed:
      puts(pcVar8);
      __ptr_00 = (void *)((long)__ptr + 1);
      sVar3 = fread(__ptr_00,sVar2,1,pFVar1);
      if (sVar3 == 1) {
        fclose(pFVar1);
        puts(
            "+-------------------------------------------------------------------------------------------+\n| Call Entry | FCF  |CALLTYP|Carrier|Flags2| Phone Number       | Class | Class Description |\n+------------+------+-------+-------+------+--------------------+-------+-------------------+"
            );
        lVar7 = 0;
        do {
          if ((sVar2 == 0xd48) || (sVar2 == 0xbf4)) {
            lVar5 = lVar7 * 0x11;
          }
          else {
            lVar5 = lVar7 * 0xc;
          }
          pbVar9 = (byte *)(lVar5 + (long)__ptr_00);
          if (pbVar9[4] != 0) {
            pcVar8 = callscrn_num_to_string(phone_number_str,0x14,pbVar9 + 4,local_60);
            phone_number_str[0] = *pcVar8;
            printf("| %3d (0x%02x) | 0x%02x |%s|  0x%02x | 0x%02x | %18s |  0x%02x | ",
                   lVar7 + 1U & 0xffffffff,lVar7 + 1U & 0xffffffff,(ulong)*pbVar9,
                   call_type_strings[pbVar9[1] & 0xf],(ulong)pbVar9[2],(ulong)pbVar9[3],
                   phone_number_str,(ulong)pbVar9[0xd]);
            ppcVar4 = str_call_class;
            lVar5 = 0;
            do {
              if (pbVar9[0xd] == call_class_lut[lVar5]) {
                printf("%s | ",*ppcVar4);
                break;
              }
              lVar5 = lVar5 + 1;
              ppcVar4 = ppcVar4 + 1;
            } while (lVar5 != 5);
            print_bits(*pbVar9,callscrn_free_flags_str);
            print_bits(pbVar9[3],callscrn_ident2_str);
            putchar(10);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != local_68);
        puts(
            "+-------------------------------------------------------------------------------------------+"
            );
        iVar6 = 0;
        if (argc == 2) {
LAB_001045d3:
          free(__ptr);
          return iVar6;
        }
        pFVar1 = fopen(argv[2],"wb");
        if (pFVar1 != (FILE *)0x0) {
          iVar6 = 0;
          printf("\nWriting new table to %s (%zu bytes)\n",argv[2],sVar2);
          sVar2 = fwrite(__ptr_00,sVar2,1,pFVar1);
          if (sVar2 != 1) {
            printf("Error writing output file %s\n",argv[2]);
            iVar6 = -5;
          }
          fclose(pFVar1);
          goto LAB_001045d3;
        }
        printf("Error opening output file %s for write.\n",argv[2]);
        goto LAB_00104364;
      }
      puts("Error reading CALLSCRN table.");
    }
    free(__ptr);
    fclose(pFVar1);
    iVar6 = -5;
  }
  return iVar6;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE  *instream;
    FILE  *ostream = NULL;
    int    callscrn_index;
    char   phone_number_str[20] = { 0 };
    size_t i;
    int    callscrn_max_entries = 0;
    int    phone_num_len = 0;
    size_t size;
    int    ret = 0;

    dlog_mt_call_screen_list_t *pcallscrn_table;
    dlog_mt_call_screen_universal_t* pcallscrnu_table;
    uint8_t* load_buffer;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_callscrn mm_table_18.bin [outputfile.bin]\n"
               "\tmm_callscrn mm_table_3b.bin [outputfile.bin]\n"
               "\tmm_callscrn mm_table_5c.bin [outputfile.bin]\n");
        return -1;
    }

    printf("Nortel Millennium Call Screening List Table 24, 59, 92 (0x18, 0x3b, 0x5c) Dump\n\n");

    pcallscrn_table = (dlog_mt_call_screen_list_t *)calloc(1, CALLSCRN_TABLE_LEN_MTR19);
    pcallscrnu_table = (dlog_mt_call_screen_universal_t *)pcallscrn_table;

    if (pcallscrn_table == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_call_screen_list_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(pcallscrn_table);
        return -ENOENT;
    }

    fseek(instream, 0, SEEK_END);
    size = ftell(instream);
    fseek(instream, 0, SEEK_SET);

    switch (size + 1) {
    case CALLSCRNU_TABLE_LEN:
        printf("Call Screen Universal (60-entry) table.\n");
        callscrn_max_entries = CALLSCRNU_TABLE_MAX;
        phone_num_len = 8;
        break;
    case CALLSCRNE_TABLE_LEN:
        printf("Call Screen Enhanced (85-entry) table.\n");
        callscrn_max_entries = CALLSCRNE_TABLE_MAX;
        phone_num_len = 8;
        break;
    case CALLSCRN_TABLE_LEN:
        printf("Call Screening List (180-entry) table.\n");
        callscrn_max_entries = CALLSCRN_TABLE_MAX;
        phone_num_len = 9;
        break;
    case CALLSCRN_TABLE_LEN_MTR19:
        printf("Call Screening List (200-entry) table.\n");
        callscrn_max_entries = 200;
        phone_num_len = 9;
        break;
    default:
        printf("Invalid Call Screening table, len=%zu.\n", size);
        free(pcallscrn_table);
        fclose(instream);
        return -EIO;
    }

    load_buffer = ((uint8_t*)pcallscrn_table) + 1;
    if (fread(load_buffer, size, 1, instream) != 1) {
        printf("Error reading CALLSCRN table.\n");
        free(pcallscrn_table);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+-------------------------------------------------------------------------------------------+\n" \
           "| Call Entry | FCF  |CALLTYP|Carrier|Flags2| Phone Number       | Class | Class Description |\n" \
           "+------------+------+-------+-------+------+--------------------+-------+-------------------+\n");

    for (callscrn_index = 0; callscrn_index < callscrn_max_entries; callscrn_index++) {
        call_screen_list_entry_t *pcallscreen_entry;

        switch (size + 1) {
        case CALLSCRN_TABLE_LEN:        /* 180-entry table */
        case CALLSCRN_TABLE_LEN_MTR19:  /* 200-entry table */
            pcallscreen_entry = &pcallscrn_table->entry[callscrn_index];
            break;
        default:                        /* All other tables */
            pcallscreen_entry = (call_screen_list_entry_t *)&pcallscrnu_table->entry[callscrn_index];
            break;
        }

        if (pcallscreen_entry->phone_number[0] == 0) continue;

        *phone_number_str = *callscrn_num_to_string(phone_number_str, sizeof(phone_number_str),
                                                    pcallscreen_entry->phone_number, phone_num_len);

        printf("| %3d (0x%02x) | 0x%02x |%s|  0x%02x | 0x%02x | %18s |  0x%02x | ",
               callscrn_index + 1, callscrn_index + 1,
               pcallscreen_entry->free_call_flags,
               call_type_strings[(pcallscreen_entry->call_type) & 0x0F],
               pcallscreen_entry->carrier_ref,
               pcallscreen_entry->ident2,
               phone_number_str,
               pcallscreen_entry->cs_class);

        for (i = 0; i < sizeof(call_class_lut); i++) {
            if (pcallscreen_entry->cs_class == call_class_lut[i]) {
                printf("%s | ", str_call_class[i]);
                break;
            }
        }
        print_bits(pcallscreen_entry->free_call_flags, (char **)callscrn_free_flags_str);
        print_bits(pcallscreen_entry->ident2,          (char **)callscrn_ident2_str);
        printf("\n");
    }

    printf("+-------------------------------------------------------------------------------------------+\n");

    /* Modify CALLSCRN table */

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            return -ENOENT;
        }
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s (%zu bytes)\n", argv[2], size);

        if (fwrite(load_buffer, size, 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (pcallscrn_table != NULL) {
        free(pcallscrn_table);
    }

    return ret;
}